

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
PlayerTableIRCCommand::trigger
          (PlayerTableIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  Server *pSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  Server *pSVar9;
  long lVar10;
  undefined8 *puVar11;
  Server *pSVar12;
  _Node *__temp_2;
  undefined8 *puVar13;
  bool bVar14;
  size_t sVar15;
  uint uVar16;
  size_t sVar17;
  _Node *__temp;
  undefined8 *puVar18;
  Server *pSVar19;
  size_t sVar20;
  _Node *__temp_1;
  ulong uVar21;
  undefined8 *puVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  string_view color;
  string_view color_00;
  string_view color_01;
  ulong local_d8;
  string_view channel_local;
  anon_class_64_8_03ae175d output_player;
  
  channel_local._M_str = channel._M_str;
  channel_local._M_len = channel._M_len;
  Jupiter::IRC::Client::getChannel
            (source,channel_local._M_len,channel_local._M_str,channel_local._M_str,nick._M_len,
             nick._M_str);
  iVar6 = Jupiter::IRC::Client::Channel::getType();
  color = (string_view)RenX::getTeamColor(GDI);
  color_00 = (string_view)RenX::getTeamColor(Nod);
  color_01 = (string_view)RenX::getTeamColor(Other);
  RenX::getTeamName(GDI);
  RenX::getTeamName(Nod);
  RenX::getTeamName(Other);
  RenX::getCore();
  lVar7 = RenX::Core::getServerCount();
  if (lVar7 != 0) {
    bVar14 = true;
    uVar21 = 0;
    do {
      uVar8 = RenX::getCore();
      pSVar9 = (Server *)RenX::Core::getServer(uVar8);
      cVar5 = RenX::Server::isLogChanType((int)pSVar9);
      if (cVar5 != '\0') {
        lVar7 = *(long *)(pSVar9 + 0x20);
        lVar10 = RenX::Server::getBotCount();
        if (lVar7 == lVar10) {
          Jupiter::IRC::Client::sendMessage
                    (source,channel_local._M_len,channel_local._M_str,0x17,"No players are in-game."
                    );
          bVar14 = false;
        }
        else {
          pSVar12 = pSVar9 + 0x10;
          pSVar19 = *(Server **)pSVar12;
          if (pSVar19 == pSVar12) {
            local_d8 = 8;
            uVar16 = 999;
            puVar18 = (undefined8 *)0x0;
            puVar22 = (undefined8 *)0x0;
            puVar13 = (undefined8 *)0x0;
            dVar24 = 9999999.0;
            dVar23 = 99999.0;
          }
          else {
            uVar16 = 999;
            local_d8 = 8;
            dVar23 = 99999.0;
            dVar24 = 9999999.0;
            puVar13 = (undefined8 *)0x0;
            puVar22 = (undefined8 *)0x0;
            puVar18 = (undefined8 *)0x0;
            do {
              if (pSVar19[0x110] == (Server)0x0) {
                if (local_d8 < *(ulong *)(pSVar19 + 0x20)) {
                  local_d8 = *(ulong *)(pSVar19 + 0x20);
                }
                pSVar1 = pSVar19 + 0x10;
                if ((int)uVar16 < (int)*(uint *)(pSVar19 + 0x10c)) {
                  uVar16 = *(uint *)(pSVar19 + 0x10c);
                }
                dVar25 = *(double *)(pSVar19 + 0x118);
                if (*(double *)(pSVar19 + 0x118) <= dVar23) {
                  dVar25 = dVar23;
                }
                dVar23 = *(double *)(pSVar19 + 0x120);
                if (*(double *)(pSVar19 + 0x120) <= dVar24) {
                  dVar23 = dVar24;
                }
                dVar24 = dVar23;
                dVar23 = dVar25;
                if (*(int *)(pSVar19 + 0x108) == 1) {
                  puVar11 = (undefined8 *)operator_new(0x10);
                  puVar11[1] = pSVar1;
                  *puVar11 = puVar22;
                  puVar22 = puVar11;
                }
                else if (*(int *)(pSVar19 + 0x108) == 0) {
                  puVar11 = (undefined8 *)operator_new(0x10);
                  puVar11[1] = pSVar1;
                  *puVar11 = puVar13;
                  puVar13 = puVar11;
                }
                else {
                  puVar11 = (undefined8 *)operator_new(0x10);
                  puVar11[1] = pSVar1;
                  *puVar11 = puVar18;
                  puVar18 = puVar11;
                }
              }
              pSVar19 = *(Server **)pSVar19;
            } while (pSVar19 != pSVar12);
          }
          sVar15 = 1;
          do {
            sVar15 = sVar15 + 1;
            bVar14 = 99 < uVar16;
            uVar16 = uVar16 / 10;
          } while (bVar14);
          sVar17 = 0;
          do {
            dVar23 = dVar23 / 10.0;
            sVar17 = sVar17 + 1;
          } while (1.0 <= dVar23);
          sVar20 = 0;
          do {
            dVar24 = dVar24 / 10.0;
            sVar20 = sVar20 + 1;
          } while (1.0 <= dVar24);
          cVar5 = RenX::Server::isAdminLogChanType((int)pSVar9);
          pcVar4 = channel_local._M_str;
          sVar3 = channel_local._M_len;
          if (cVar5 == '\0') {
            string_printf_abi_cxx11_
                      ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s",local_d8,
                       "Nickname",sVar15,"ID",sVar17,"Score",sVar20,"Credits");
            Jupiter::IRC::Client::sendMessage
                      (source,sVar3,pcVar4,CONCAT44(output_player._12_4_,output_player.type),
                       output_player.server);
          }
          else {
            string_printf_abi_cxx11_
                      ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s | IP Address",
                       local_d8,"Nickname",sVar15,"ID",sVar17,"Score",sVar20,"Credits");
            Jupiter::IRC::Client::sendMessage
                      (source,sVar3,pcVar4,CONCAT44(output_player._12_4_,output_player.type),
                       output_player.server);
          }
          if (output_player.server != (Server *)&output_player.source) {
            operator_delete(output_player.server,(ulong)(output_player.source + 1));
          }
          output_player.channel = &channel_local;
          output_player.idColLen = sVar15;
          output_player.scoreColLen = sVar17;
          output_player.creditColLen = sVar20;
          output_player.source = source;
          output_player.server = pSVar9;
          output_player.type = iVar6;
          output_player.maxNickLen = local_d8;
          for (puVar11 = puVar13; puVar2 = puVar22, puVar11 != (undefined8 *)0x0;
              puVar11 = (undefined8 *)*puVar11) {
            trigger::anon_class_64_8_03ae175d::operator()
                      (&output_player,(PlayerInfo *)puVar11[1],color);
          }
          for (; puVar11 = puVar18, puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
            trigger::anon_class_64_8_03ae175d::operator()
                      (&output_player,(PlayerInfo *)puVar2[1],color_00);
          }
          for (; puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
            trigger::anon_class_64_8_03ae175d::operator()
                      (&output_player,(PlayerInfo *)puVar11[1],color_01);
          }
          while (puVar18 != (undefined8 *)0x0) {
            puVar11 = (undefined8 *)*puVar18;
            operator_delete(puVar18,0x10);
            puVar18 = puVar11;
          }
          while (puVar22 != (undefined8 *)0x0) {
            puVar18 = (undefined8 *)*puVar22;
            operator_delete(puVar22,0x10);
            puVar22 = puVar18;
          }
          if (puVar13 == (undefined8 *)0x0) {
            bVar14 = false;
          }
          else {
            do {
              puVar18 = (undefined8 *)*puVar13;
              operator_delete(puVar13,0x10);
              puVar13 = puVar18;
            } while (puVar18 != (undefined8 *)0x0);
            bVar14 = false;
          }
        }
      }
      uVar21 = (ulong)((int)uVar21 + 1);
      RenX::getCore();
      uVar8 = RenX::Core::getServerCount();
    } while (uVar8 != uVar21);
    if (!bVar14) {
      return;
    }
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel_local._M_len,channel_local._M_str,0x40,
             "Error: Channel not attached to any connected Renegade X servers.");
  return;
}

Assistant:

void PlayerTableIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				std::forward_list<RenX::PlayerInfo *> gPlayers;
				std::forward_list<RenX::PlayerInfo *> nPlayers;
				std::forward_list<RenX::PlayerInfo *> oPlayers;

				size_t maxNickLen = 8;
				int highID = 999;
				double highScore = 99999.0;
				double highCredits = 9999999.0;

				RenX::PlayerInfo *player;
				for (auto node = server->players.begin(); node != server->players.end(); ++node)
				{
					player = &*node;
					if (player != nullptr && player->isBot == false)
					{
						if (player->name.size() > maxNickLen)
							maxNickLen = player->name.size();

						if (player->id > highID)
							highID = player->id;

						if (player->score > highScore)
							highScore = player->score;

						if (player->credits > highCredits)
							highCredits = player->credits;

						switch (player->team)
						{
						case RenX::TeamType::GDI:
							gPlayers.push_front(player);
							break;
						case RenX::TeamType::Nod:
							nPlayers.push_front(player);
							break;
						default:
							oPlayers.push_front(player);
							break;
						}
					}
				}

				size_t idColLen = 1, scoreColLen = 1, creditColLen = 1;

				while ((highID /= 10) > 0)
					++idColLen;

				while ((highScore /= 10) >= 1.0)
					++scoreColLen;

				while ((highCredits /= 10) >= 1.0)
					++creditColLen;

				if (server->isAdminLogChanType(type))
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s | IP Address", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));
				else
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));

				auto output_player = [server, type, source, &channel, maxNickLen, idColLen, scoreColLen, creditColLen](RenX::PlayerInfo *player, std::string_view color)
				{
					if (server->isAdminLogChanType(type))
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCNORMAL " %.*s", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits, player->ip.size(), player->ip.data()));
					else
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits));
				};

				for (auto node = gPlayers.begin(); node != gPlayers.end(); ++node)
					output_player(*node, gTeamColor);

				for (auto node = nPlayers.begin(); node != nPlayers.end(); ++node)
					output_player(*node, nTeamColor);

				for (auto node = oPlayers.begin(); node != oPlayers.end(); ++node)
					output_player(*node, oTeamColor);
			}
			else source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}